

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void pd_defaultsymbol(t_pd *x,t_symbol *s)

{
  undefined1 local_38 [8];
  t_atom at_1;
  t_atom at;
  t_symbol *s_local;
  t_pd *x_local;
  
  if ((*x)->c_listmethod == pd_defaultlist) {
    local_38._0_4_ = A_SYMBOL;
    at_1._0_8_ = s;
    (*(*x)->c_anymethod)(x,&s_symbol,1,(t_atom *)local_38);
  }
  else {
    at_1.a_w.w_float = 2.8026e-45;
    (*(*x)->c_listmethod)(x,(t_symbol *)0x0,1,(t_atom *)&at_1.a_w);
  }
  return;
}

Assistant:

static void pd_defaultsymbol(t_pd *x, t_symbol *s)
{
    if (*(*x)->c_listmethod != pd_defaultlist)
    {
        t_atom at;
        SETSYMBOL(&at, s);
        (*(*x)->c_listmethod)(x, 0, 1, &at);
    }
    else
    {
        t_atom at;
        SETSYMBOL(&at, s);
        (*(*x)->c_anymethod)(x, &s_symbol, 1, &at);
    }
}